

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

int __thiscall el::base::RegisteredLoggers::remove(RegisteredLoggers *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  Logger *extraout_RAX;
  Logger *local_28;
  Logger *logger;
  string *id_local;
  RegisteredLoggers *this_local;
  
  logger = (Logger *)__filename;
  id_local = (string *)this;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __filename,consts::kDefaultLoggerId);
  local_28 = (Logger *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    local_28 = utils::
               Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&this->
                      super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)logger);
    if (local_28 != (Logger *)0x0) {
      unregister(this,&local_28);
      local_28 = extraout_RAX;
    }
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)local_28 >> 8),this_local._7_1_);
}

Assistant:

bool RegisteredLoggers::remove(const std::string& id) {
  if (id == base::consts::kDefaultLoggerId) {
    return false;
  }
  Logger* logger = base::utils::Registry<Logger, std::string>::get(id);
  if (logger != nullptr) {
    unregister(logger);
  }
  return true;
}